

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Push
          (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this,iterator it)

{
  iterator iVar1;
  BuildsystemDirectoryStateType BStack_1e8;
  
  memset(&BStack_1e8,0,0x1b8);
  BStack_1e8.Location._M_string_length = 0;
  BStack_1e8.Location.field_2._M_local_buf[0] = '\0';
  BStack_1e8.OutputLocation._M_dataplus._M_p = (pointer)&BStack_1e8.OutputLocation.field_2;
  BStack_1e8.OutputLocation._M_string_length = 0;
  BStack_1e8.OutputLocation.field_2._M_local_buf[0] = '\0';
  BStack_1e8.RelativePathTopSource._M_dataplus._M_p =
       (pointer)&BStack_1e8.RelativePathTopSource.field_2;
  BStack_1e8.CurrentSourceDirectoryComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_1e8.CurrentSourceDirectoryComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_1e8.CurrentSourceDirectoryComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BStack_1e8.CurrentBinaryDirectoryComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_1e8.CurrentBinaryDirectoryComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_1e8.CurrentBinaryDirectoryComponents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BStack_1e8.RelativePathTopSource._M_string_length = 0;
  BStack_1e8.RelativePathTopSource.field_2._M_local_buf[0] = '\0';
  BStack_1e8.RelativePathTopBinary._M_dataplus._M_p =
       (pointer)&BStack_1e8.RelativePathTopBinary.field_2;
  BStack_1e8.RelativePathTopBinary._M_string_length = 0;
  BStack_1e8.RelativePathTopBinary.field_2._M_local_buf[0] = '\0';
  BStack_1e8.Location._M_dataplus._M_p = (pointer)&BStack_1e8.Location.field_2;
  memset(&BStack_1e8.IncludeDirectories,0,0x90);
  BStack_1e8.ProjectName._M_string_length = 0;
  BStack_1e8.ProjectName.field_2._M_local_buf[0] = '\0';
  BStack_1e8.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &BStack_1e8.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header;
  BStack_1e8.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  BStack_1e8.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  BStack_1e8.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  BStack_1e8.Children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  BStack_1e8.Children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BStack_1e8.Children.super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BStack_1e8.ProjectName._M_dataplus._M_p = (pointer)&BStack_1e8.ProjectName.field_2;
  BStack_1e8.Properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       BStack_1e8.Properties.
       super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar1 = Push_impl(this,it,&BStack_1e8);
  cmState::BuildsystemDirectoryStateType::~BuildsystemDirectoryStateType(&BStack_1e8);
  return iVar1;
}

Assistant:

iterator Push(iterator it)
  {
    return Push_impl(it, T());
  }